

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall S2BooleanOperation::Impl::BuildOpType(Impl *this,OpType op_type)

{
  S2BooleanOperation *pSVar1;
  bool bVar2;
  bool bVar3;
  bool invert_a;
  bool invert_b;
  bool invert_result;
  S2LogMessage local_b0;
  CrossingProcessor local_a0;
  
  pSVar1 = this->op_;
  local_a0.builder_ =
       (this->builder_)._M_t.super___uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>._M_t.
       super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
       super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl;
  local_a0.polyline_loops_have_boundaries_ = (pSVar1->options_).polyline_loops_have_boundaries_;
  local_a0.input_dimensions_ = &this->input_dimensions_;
  local_a0.input_crossings_ = &this->input_crossings_;
  local_a0.polygon_model_ = (pSVar1->options_).polygon_model_;
  local_a0.polyline_model_ = (pSVar1->options_).polyline_model_;
  local_a0.prev_inside_ = false;
  local_a0.source_edge_crossings_.
  super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.source_edge_crossings_.
  super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.source_edge_crossings_.
  super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.source_id_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_2UL,_false>
  .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            )(Storage<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_2UL,_false>
              )0x0;
  local_a0.source_id_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)0x0;
  local_a0.source_id_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  switch(op_type) {
  case UNION:
    invert_a = true;
    invert_b = true;
    invert_result = true;
    break;
  case INTERSECTION:
    invert_b = false;
    goto LAB_0019f5f2;
  case DIFFERENCE:
    invert_b = true;
LAB_0019f5f2:
    invert_a = false;
    invert_result = false;
    break;
  case SYMMETRIC_DIFFERENCE:
    bVar2 = AddBoundaryPair(this,false,true,false,&local_a0);
    invert_a = true;
    bVar3 = false;
    invert_b = false;
    invert_result = false;
    if (!bVar2) goto LAB_0019f60e;
    break;
  default:
    S2LogMessage::S2LogMessage
              (&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,1999,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_b0.stream_,"Invalid S2BooleanOperation::OpType");
    abort();
  }
  bVar3 = AddBoundaryPair(this,invert_a,invert_b,invert_result,&local_a0);
LAB_0019f60e:
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  ::~btree((btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
            *)&local_a0.source_id_map_);
  if (local_a0.source_edge_crossings_.
      super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.source_edge_crossings_.
                    super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool S2BooleanOperation::Impl::BuildOpType(OpType op_type) {
  // CrossingProcessor does the real work of emitting the output edges.
  CrossingProcessor cp(op_->options_.polygon_model(),
                       op_->options_.polyline_model(),
                       op_->options_.polyline_loops_have_boundaries(),
                       builder_.get(), &input_dimensions_, &input_crossings_);
  switch (op_type) {
    case OpType::UNION:
      // A | B == ~(~A & ~B)
      return AddBoundaryPair(true, true, true, &cp);

    case OpType::INTERSECTION:
      // A & B
      return AddBoundaryPair(false, false, false, &cp);

    case OpType::DIFFERENCE:
      // A - B = A & ~B
      return AddBoundaryPair(false, true, false, &cp);

    case OpType::SYMMETRIC_DIFFERENCE:
      // Compute the union of (A - B) and (B - A).
      return (AddBoundaryPair(false, true, false, &cp) &&
              AddBoundaryPair(true, false, false, &cp));
  }
  S2_LOG(FATAL) << "Invalid S2BooleanOperation::OpType";
  return false;
}